

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

void CVmObjString::parse_num_val(vm_val_t *retval,char *str,size_t len,int radix,int int_only)

{
  bool bVar1;
  wchar_t wVar2;
  uint uVar3;
  wchar_t wVar4;
  vm_obj_id_t vVar5;
  byte *p;
  byte *pbVar6;
  vm_datatype_t vVar7;
  vm_obj_id_t vVar8;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  byte *p_00;
  bool bVar12;
  ulong local_38;
  
  pbVar10 = (byte *)len;
  pbVar6 = (byte *)str;
  if (len != 0) {
    do {
      wVar2 = utf8_ptr::s_getch((char *)pbVar6);
      uVar3 = t3_get_chartype(wVar2);
      if ((uVar3 & 0xfffffffe) != 6) {
        wVar2 = utf8_ptr::s_getch((char *)pbVar6);
        bVar1 = wVar2 != L'-';
        if ((wVar2 == L'-') || (wVar4 = utf8_ptr::s_getch((char *)pbVar6), wVar4 == L'+')) {
          bVar12 = wVar2 == L'-';
          uVar9 = 0;
          p = pbVar6 + (ulong)(((*pbVar6 >> 5 & 1) != 0) + 1 & (uint)(*pbVar6 >> 7) * 3) + 1;
          pbVar10 = pbVar6 + ((long)pbVar10 - (long)p);
          if (pbVar10 == (byte *)0x0) goto LAB_00284044;
        }
        else {
          bVar1 = true;
          bVar12 = false;
          p = pbVar6;
        }
        uVar9 = 0;
        goto LAB_002840f2;
      }
      pbVar10 = pbVar6 + ((long)pbVar10 -
                         (long)(pbVar6 + (ulong)(((*pbVar6 >> 5 & 1) != 0) + 1 &
                                                (uint)(*pbVar6 >> 7) * 3) + 1));
      pbVar6 = pbVar6 + (ulong)(((*pbVar6 >> 5 & 1) != 0) + 1 & (uint)(*pbVar6 >> 7) * 3) + 1;
    } while (pbVar10 != (byte *)0x0);
  }
  bVar12 = false;
  uVar9 = 0;
  goto LAB_00284044;
  while( true ) {
    pbVar10 = p + ((long)pbVar10 -
                  (long)(p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1));
    p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
    if (pbVar10 == (byte *)0x0) break;
LAB_002840f2:
    wVar2 = utf8_ptr::s_getch((char *)p);
    uVar3 = t3_get_chartype(wVar2);
    if ((uVar3 & 0xfffffffe) != 6) {
      uVar9 = 0;
      local_38 = 0x80000000;
      goto LAB_00284166;
    }
  }
  goto LAB_00284044;
LAB_00284166:
  do {
    wVar2 = utf8_ptr::s_getch((char *)p);
    if (radix == 10 && int_only == 0) {
      if ((wVar2 == L'E') || (wVar2 == L'e')) {
        p_00 = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
        pbVar6 = p + ((long)pbVar10 - (long)p_00);
        wVar4 = utf8_ptr::s_getch((char *)p_00);
        if ((((wVar4 != L'+') && (wVar4 = utf8_ptr::s_getch((char *)p_00), wVar4 != L'-')) ||
            (pbVar10 = p_00 + (long)pbVar10,
            p_00 = p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1,
            pbVar10 != p_00)) &&
           (wVar4 = utf8_ptr::s_getch((char *)p_00), 0xfffffff5 < (uint)(wVar4 + L'\xffffffc6')))
        goto LAB_00284319;
        goto LAB_00284245;
      }
      if (wVar2 != L'.') goto LAB_0028418e;
LAB_00284319:
      radix = 10;
LAB_00284305:
      vVar5 = CVmObjBigNum::create_radix(0,str,len,radix);
      vVar7 = VM_OBJ;
      goto LAB_00284060;
    }
LAB_0028418e:
    uVar3 = wVar2 + L'\xffffffd0';
    pbVar6 = pbVar10;
    if (9 < uVar3) {
LAB_00284245:
      pbVar10 = pbVar6;
      if ((uint)(wVar2 + L'\xffffff9f') < 0x1a) {
        uVar3 = wVar2 + L'\xffffffa9';
      }
      else {
        if (0x19 < (uint)(wVar2 + L'\xffffffbf')) break;
        uVar3 = wVar2 + L'\xffffffc9';
      }
    }
    if (radix <= (int)uVar3) break;
    uVar11 = local_38;
    if ((bVar1) &&
       ((0x10 < (uint)radix || (uVar11 = 0xffffffff, (0x10104U >> (radix & 0x1fU) & 1) == 0)))) {
      uVar11 = 0x7fffffff;
    }
    if (uVar11 / (uint)radix < uVar9) {
LAB_002842f2:
      if (int_only != 0) {
        err_throw(0x7e7);
      }
      goto LAB_00284305;
    }
    uVar9 = uVar9 * (uint)radix;
    uVar11 = uVar11 - uVar3;
    if (uVar11 <= uVar9 && uVar9 - uVar11 != 0) goto LAB_002842f2;
    uVar9 = uVar9 + uVar3;
    pbVar10 = p + ((long)pbVar10 -
                  (long)(p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1));
    p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
  } while (pbVar10 != (byte *)0x0);
LAB_00284044:
  vVar8 = (vm_obj_id_t)uVar9;
  vVar5 = -vVar8;
  if (0x7fffffff < uVar9) {
    vVar5 = vVar8;
  }
  if (!bVar12) {
    vVar5 = vVar8;
  }
  vVar7 = VM_INT;
LAB_00284060:
  retval->typ = vVar7;
  (retval->val).obj = vVar5;
  return;
}

Assistant:

void CVmObjString::parse_num_val(VMG_ vm_val_t *retval,
                                 const char *str, size_t len,
                                 int radix, int int_only)
{
    utf8_ptr p;
    size_t rem;

    /* skip leading spaces */
    for (p.set((char *)str), rem = len ;
         rem != 0 && t3_is_whitespace(p.getch()) ; p.inc(&rem)) ;
    
    /* presume it's positive */
    int is_neg = FALSE;
    
    /* check for a leading + or - */
    if (rem != 0)
    {
        if (p.getch() == '-')
        {
            /* note the sign and skip the character */
            is_neg = TRUE;
            p.inc(&rem);
        }
        else if (p.getch() == '+')
        {
            /* skip the character */
            p.inc(&rem);
        }
    }

    /* skip any additional spaces after the sign */
    for ( ; rem != 0 && t3_is_whitespace(p.getch()) ; p.inc(&rem)) ;
    
    /* clear the accumulator */
    unsigned long acc = 0;
    
    /* scan the digits */
    for ( ; rem != 0 ; p.inc(&rem))
    {
        /* get the next digit */
        wchar_t ch = p.getch();

        /* 
         *   If we're allowed to promote to BigNumber, and the radix is
         *   decimal, check for '.' and 'E' (for exponent) notation.  These
         *   could indicate a floating point value.  
         */
        if (radix == 10 && !int_only && (ch == '.' || ch == 'e' || ch == 'E'))
        {
            /* presume we're going to promote to BigNumber */
            int promote = TRUE;
            
            /* 
             *   If it's an exponent, parse further to make sure it looks
             *   like a valid exponent: we can have an optional + or - sign,
             *   then need at least one digit.  
             */
            if (ch == 'e' || ch == 'E')
            {
                /* set up a second pointer */
                utf8_ptr p2(p);
                size_t rem2 = rem;

                /* skip the 'e' */
                p2.inc(&rem);

                /* if there's a sign, skip it */
                if (rem2 != 0 && (p2.getch() == '+' || p2.getch() == '-'))
                    p2.inc(&rem2);

                /* we need a digit at this point, or it's not an exponent */
                promote = (rem2 != 0 && is_digit(p2.getch()));
            }

            /* if we're promoting after all, go do the promotion */
            if (promote)
            {
                /* re-parse it as a BigNumber value */
                retval->set_obj(CVmObjBigNum::create_radix(
                    vmg_ FALSE, str, len, radix));

                /* return this value */
                return;
            }
        }

        /* get the integer value of the digit, treating A-Z as digits 10-35 */
        int dig;
        if (ch >= '0' && ch <= '9')
            dig = (int)(ch - '0');
        else if (ch >= 'a' && ch <= 'z')
            dig = (int)(ch - 'a' + 10);
        else if (ch >= 'A' && ch <= 'Z')
            dig = (int)(ch - 'A' + 10);
        else
            break;

        /* if it's outside the radix limit, it's not a digit after all */
        if (dig >= radix)
            break;

        /* 
         *   Make sure we're not going to overflow.  If the base is 2, 8, or
         *   16, and there wasn't a "-" sign, allow the value to go up to the
         *   unsigned 32-bit limit, 0xffffffff.  Otherwise, limit it to
         *   32-bit signed, -0x8000000 to +0x7ffffff.  
         */
        unsigned long limit =
            (!is_neg && (radix == 2 || radix == 8 || radix == 16))
            ? 0xffffffff
            : is_neg ? 0x80000000 : 0x7fffffff;
        
        /* shift the accumulator by the radix, checking for overflow */
        if (acc > limit/radix)
            goto overflow;
        acc *= radix;

        /* add the digit, checking for overflow */
        if (acc > limit - dig)
            goto overflow;
        acc += dig;
    }
    
    /* apply the sign, if appropriate, and set the return value */
    retval->set_int(is_neg && acc <= 0x7FFFFFFF ? -(long)acc : (long)acc);
    return;

overflow:
    /*
     *   We overflowed the plain integer type.  If we're allowed to promote
     *   to a BigNumber, re-parse the value as a BigNumber.  If not, it's an
     *   error.
     */
    if (int_only)
    {
        /* we can't promote to BigNumber - throw an overflow error */
        err_throw(VMERR_NUM_OVERFLOW);
    }
    else
    {
        /* re-parse it as a BigNumber value */
        retval->set_obj(CVmObjBigNum::create_radix(
            vmg_ FALSE, str, len, radix));
    }
}